

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O3

EGUI_BUTTON_IMAGE_STATE __thiscall
irr::gui::CGUIButton::getImageState(CGUIButton *this,bool pressed)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  CGUIButton *pCVar4;
  EGUI_BUTTON_IMAGE_STATE EVar5;
  
  bVar1 = (**(code **)(**(long **)&this->field_0x128 + 0x28))(*(long **)&this->field_0x128,this,0);
  pCVar4 = (CGUIButton *)(**(code **)(**(long **)&this->field_0x128 + 0x18))();
  cVar2 = (**(code **)(*(long *)this + 0x90))(this);
  EVar5 = EGBIS_IMAGE_DISABLED;
  if (cVar2 != '\0') {
    bVar3 = pCVar4 == this & bVar1;
    if (pressed) {
      EVar5 = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
      if (bVar3 == 0) {
        EVar5 = EGBIS_IMAGE_DOWN_FOCUSED;
        if (bVar1 == 0) {
          EVar5 = pCVar4 == this | EGBIS_IMAGE_DOWN;
        }
      }
    }
    else {
      EVar5 = EGBIS_IMAGE_UP_MOUSEOVER;
      if (bVar1 != 0) {
        EVar5 = bVar3 | EGBIS_IMAGE_UP_FOCUSED;
      }
      if ((~bVar1 & pCVar4 != this) != 0) {
        return EGBIS_IMAGE_UP;
      }
    }
  }
  do {
    if (this->ButtonImages[EVar5].Texture != (ITexture *)0x0) {
      return EVar5;
    }
    switch(EVar5) {
    case EGBIS_IMAGE_UP_FOCUSED:
      EVar5 = EGBIS_IMAGE_UP_MOUSEOVER;
      break;
    case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
      EVar5 = EGBIS_IMAGE_UP_FOCUSED;
      break;
    default:
      goto switchD_0020f859_caseD_4;
    case EGBIS_IMAGE_DOWN_MOUSEOVER:
      EVar5 = EGBIS_IMAGE_DOWN;
      break;
    case EGBIS_IMAGE_DOWN_FOCUSED:
      EVar5 = EGBIS_IMAGE_DOWN_MOUSEOVER;
      break;
    case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
      EVar5 = EGBIS_IMAGE_DOWN_FOCUSED;
      break;
    case EGBIS_IMAGE_DISABLED:
      EVar5 = (uint)pressed << 2;
    }
  } while (EVar5 != EGBIS_IMAGE_UP);
switchD_0020f859_caseD_4:
  return EGBIS_IMAGE_UP;
}

Assistant:

EGUI_BUTTON_IMAGE_STATE CGUIButton::getImageState(bool pressed) const
{
	// figure state we should have
	EGUI_BUTTON_IMAGE_STATE state = EGBIS_IMAGE_DISABLED;
	bool focused = Environment->hasFocus(this);
	bool mouseOver = static_cast<const IGUIElement *>(Environment->getHovered()) == this; // (static cast for Borland)
	if (isEnabled()) {
		if (pressed) {
			if (focused && mouseOver)
				state = EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_DOWN_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			else
				state = EGBIS_IMAGE_DOWN;
		} else // !pressed
		{
			if (focused && mouseOver)
				state = EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER;
			else if (focused)
				state = EGBIS_IMAGE_UP_FOCUSED;
			else if (mouseOver)
				state = EGBIS_IMAGE_UP_MOUSEOVER;
			else
				state = EGBIS_IMAGE_UP;
		}
	}

	// find a compatible state that has images
	while (state != EGBIS_IMAGE_UP && !ButtonImages[(u32)state].Texture) {
		switch (state) {
		case EGBIS_IMAGE_UP_FOCUSED:
			state = EGBIS_IMAGE_UP_MOUSEOVER;
			break;
		case EGBIS_IMAGE_UP_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_UP_FOCUSED;
			break;
		case EGBIS_IMAGE_DOWN_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED:
			state = EGBIS_IMAGE_DOWN_MOUSEOVER;
			break;
		case EGBIS_IMAGE_DOWN_FOCUSED_MOUSEOVER:
			state = EGBIS_IMAGE_DOWN_FOCUSED;
			break;
		case EGBIS_IMAGE_DISABLED:
			if (pressed)
				state = EGBIS_IMAGE_DOWN;
			else
				state = EGBIS_IMAGE_UP;
			break;
		default:
			state = EGBIS_IMAGE_UP;
		}
	}

	return state;
}